

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

void Cmd_listsublights(FCommandLine *argv,APlayerPawn *who,int key)

{
  FLightNode *pFVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < numsubsectors) {
    uVar3 = 0;
    do {
      pFVar1 = subsectors[uVar3].lighthead;
      uVar2 = 0;
      if (pFVar1 != (FLightNode *)0x0) {
        uVar2 = 0;
        do {
          uVar2 = (ulong)((int)uVar2 + 1);
          pFVar1 = pFVar1->nextLight;
        } while (pFVar1 != (FLightNode *)0x0);
      }
      Printf(5,"Subsector %d - %d lights\n",uVar3 & 0xffffffff,uVar2);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)numsubsectors);
  }
  return;
}

Assistant:

CCMD(listsublights)
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		int lights = 0;

		FLightNode * node = sub->lighthead;
		while (node != NULL)
		{
			lights++;
			node = node->nextLight;
		}

		Printf(PRINT_LOG, "Subsector %d - %d lights\n", i, lights);
	}
}